

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O3

vmd_bst_node_t * vmd_bst_revert(vmd_bst_t *tree)

{
  undefined1 *puVar1;
  vmd_bst_node_t *pvVar2;
  vmd_bst_node_t *pvVar3;
  vmd_bst_node_t **ppvVar4;
  vmd_bst_node_t *pvVar5;
  vmd_bst_node_t *pvVar6;
  vmd_bst_node_t *pvVar7;
  
  pvVar7 = tree->save;
  if (pvVar7 != (vmd_bst_node_t *)0x0) {
    do {
      if ((pvVar7->field_0x20 & 0x10) != 0) {
        __assert_fail("!i->in_tree",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/an146[P]libvomid/src/bst.c"
                      ,0x293,"vmd_bst_node_t *vmd_bst_revert(vmd_bst_t *)");
      }
      memcpy(&pvVar7->parent->field_0x21,&pvVar7->field_0x21,tree->csize);
      puVar1 = &pvVar7->parent->field_0x20;
      *puVar1 = *puVar1 & 0xbf;
      pvVar3 = pvVar7->child[0];
      if (pvVar3 == pvVar7) {
        tree->save = (vmd_bst_node_t *)0x0;
      }
      else {
        if (tree->save == pvVar7) {
          tree->save = pvVar3;
          pvVar3 = pvVar7->child[0];
        }
        pvVar7->child[1]->child[0] = pvVar3;
        pvVar7->child[0]->child[1] = pvVar7->child[1];
      }
      pvVar3 = tree->free;
      if (pvVar3 == (vmd_bst_node_t *)0x0) {
        pvVar7->child[1] = pvVar7;
        pvVar7->child[0] = pvVar7;
        ppvVar4 = &tree->free;
      }
      else {
        pvVar7->child[0] = pvVar3;
        pvVar7->child[1] = pvVar3->child[1];
        pvVar3->child[1] = pvVar7;
        ppvVar4 = pvVar7->child[1]->child;
      }
      *ppvVar4 = pvVar7;
      pvVar7 = tree->save;
    } while (pvVar7 != (vmd_bst_node_t *)0x0);
  }
  pvVar7 = tree->inserted;
  if (pvVar7 == (vmd_bst_node_t *)0x0) {
    pvVar3 = (vmd_bst_node_t *)0x0;
    pvVar5 = (vmd_bst_node_t *)0x0;
  }
  else {
    pvVar5 = (vmd_bst_node_t *)0x0;
    pvVar6 = (vmd_bst_node_t *)0x0;
    do {
      pvVar3 = pvVar6;
      pvVar2 = pvVar5;
      if ((pvVar7->field_0x20 & 0x10) != 0) {
        erase_node(tree,pvVar7);
        pvVar3 = tree->free;
        if (pvVar3 == (vmd_bst_node_t *)0x0) {
          pvVar7->child[1] = pvVar7;
          pvVar7->child[0] = pvVar7;
          ppvVar4 = &tree->free;
        }
        else {
          pvVar7->child[0] = pvVar3;
          pvVar7->child[1] = pvVar3->child[1];
          pvVar3->child[1] = pvVar7;
          ppvVar4 = pvVar7->child[1]->child;
        }
        *ppvVar4 = pvVar7;
        pvVar3 = pvVar7;
        pvVar2 = pvVar7;
        if (pvVar6 != (vmd_bst_node_t *)0x0) {
          pvVar6->next = pvVar7;
          pvVar2 = pvVar5;
        }
      }
      pvVar5 = pvVar2;
      if ((pvVar7->field_0x20 & 0x20) == 0) {
        __assert_fail("i->inserted",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/an146[P]libvomid/src/bst.c"
                      ,0x2a3,"vmd_bst_node_t *vmd_bst_revert(vmd_bst_t *)");
      }
      pvVar7->field_0x20 = pvVar7->field_0x20 & 0xdf;
      pvVar7 = pvVar7->next;
      pvVar6 = pvVar3;
    } while (pvVar7 != (vmd_bst_node_t *)0x0);
  }
  pvVar7 = tree->erased;
  while( true ) {
    if (pvVar7 == (vmd_bst_node_t *)0x0) {
      pvVar7 = tree->erased;
      if (pvVar5 != (vmd_bst_node_t *)0x0) {
        pvVar3->next = pvVar7;
        pvVar7 = pvVar5;
      }
      tree->inserted = (vmd_bst_node_t *)0x0;
      tree->erased = (vmd_bst_node_t *)0x0;
      return pvVar7;
    }
    if ((pvVar7->field_0x20 & 0x20) != 0) break;
    insert_node(tree,pvVar7);
    pvVar7 = pvVar7->next;
  }
  __assert_fail("!i->inserted",
                "/workspace/llm4binary/github/license_all_cmakelists_25/an146[P]libvomid/src/bst.c",
                0x2a7,"vmd_bst_node_t *vmd_bst_revert(vmd_bst_t *)");
}

Assistant:

bst_node_t *
bst_revert(bst_t *tree)
{
	bst_node_t *i, *prev = NULL, *first = NULL;

	for (i = tree->save; i != NULL; i = tree->save) {
		assert(!i->in_tree);
		memcpy(i->parent->data, i->data, tree->csize);
		i->parent->saved = 0;
		dlist_erase(&tree->save, i);
		dlist_insert(&tree->free, i);
	}
	for (i = tree->inserted; i != NULL; i = i->next) {
		if (i->in_tree) {
			erase_node(tree, i);
			dlist_insert(&tree->free, i);
			if (prev == NULL)
				first = i;
			else
				prev->next = i;
			prev = i;
		}
		assert(i->inserted);
		i->inserted = 0;
	}
	for (i = tree->erased; i != NULL; i = i->next) {
		assert(!i->inserted);
		insert_node(tree, i);
	}

	if (first == NULL)
		first = tree->erased;
	else
		prev->next = tree->erased;

	tree->erased = tree->inserted = NULL;
	return first;
}